

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O1

void * __thiscall dic::dict_find(dic *this,int dictidx,int tableidx,void *key)

{
  long lVar1;
  char *__s2;
  uint uVar2;
  int iVar3;
  long *plVar4;
  
  lVar1 = *(long *)((this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                    super__Vector_impl_data._M_start[dictidx].ht + tableidx);
  uVar2 = murmurhash2(key);
  plVar4 = *(long **)(lVar1 + (ulong)uVar2 * 8);
  if (plVar4 != (long *)0x0) {
    __s2 = *(char **)((long)key + 8);
    do {
      iVar3 = strcmp(*(char **)(*plVar4 + 8),__s2);
      if (iVar3 == 0) {
        return plVar4;
      }
      plVar4 = (long *)plVar4[2];
    } while (plVar4 != (long *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void * dic::dict_find(int dictidx,int tableidx,void *key){
    dictEntry *fetch=NULL; 
    fetch=dc[dictidx].ht[tableidx].table[dic::murmurhash2(key)]; 
    while(fetch!=NULL)
    {
        if(strcmp((char *)((const robj *)fetch->key)->ptr,(char *)((const robj *)key)->ptr)==0)
            return (void *)fetch;
        fetch=fetch->next;
    }    

    return NULL;
}